

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_format.c
# Opt level: O0

cesl_format_t * cesl_format_i32(cesl_format_t *self,int32_t value)

{
  size_t sVar1;
  size_t min_required_size;
  int32_t value_local;
  cesl_format_t *self_local;
  
  if (self->cur_pos + 0xd < self->buf_max_size) {
    sVar1 = cesl_int32_to_str(value,self->buf + self->cur_pos,'\n');
    self->cur_pos = sVar1 + self->cur_pos;
  }
  else {
    self->error_code = 1;
  }
  return self;
}

Assistant:

cesl_format_t *cesl_format_i32(cesl_format_t *self, int32_t value)
{
    const size_t min_required_size = (sizeof(int32_t) * 8) / 3 + 3; // 1 for rounding, 1 for sign, 1 for '\0'

    if (self->cur_pos + min_required_size >= self->buf_max_size) {
        self->error_code = cesl_format_buffer_full_error;
        return self;
    }
    self->cur_pos += cesl_int32_to_str (value, &(self->buf[self->cur_pos]), 10);
    return self;
}